

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

int __thiscall QTabBar::insertTab(QTabBar *this,int index,QIcon *icon,QString *text)

{
  Tab *pTVar1;
  bool bVar2;
  int iVar3;
  QTabBarPrivate *pQVar4;
  qsizetype qVar5;
  const_reference ppTVar6;
  int *piVar7;
  QStyle *pQVar8;
  const_iterator o;
  Tab **ppTVar9;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect QVar10;
  Tab *tab;
  add_const_t<QList<QTabBarPrivate::Tab_*>_> *__range1;
  QAbstractButton *closeButton;
  ButtonPosition closeSide;
  QTabBarPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QStyleOptionTab opt;
  parameter_type in_stack_fffffffffffffe28;
  QTabBarPrivate *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  parameter_type in_stack_fffffffffffffe48;
  CloseButton *in_stack_fffffffffffffe50;
  QTabBar *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe80;
  ConnectionType type;
  Object *in_stack_fffffffffffffe88;
  QList<QTabBarPrivate::Tab_*> *in_stack_fffffffffffffe90;
  Function in_stack_fffffffffffffeb0;
  undefined8 local_100;
  undefined8 local_f8;
  const_iterator local_e0;
  code *local_d8;
  undefined8 local_d0;
  Connection local_c8;
  int local_bc;
  QKeySequence local_b8 [12];
  int local_ac;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = in_ESI;
  pQVar4 = d_func((QTabBar *)0x6ac8dd);
  bVar2 = QTabBarPrivate::validIndex
                    ((QTabBarPrivate *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                     ,in_stack_fffffffffffffe3c);
  if (bVar2) {
    type = local_ac >> 0x1f;
    in_stack_fffffffffffffe88 = (Object *)operator_new(0xf0);
    QTabBarPrivate::Tab::Tab
              ((Tab *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (QIcon *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (QString *)in_stack_fffffffffffffe30);
    QList<QTabBarPrivate::Tab_*>::insert
              ((QList<QTabBarPrivate::Tab_*> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (qsizetype)in_stack_fffffffffffffe30,in_stack_fffffffffffffe48);
  }
  else {
    qVar5 = QList<QTabBarPrivate::Tab_*>::size(&pQVar4->tabList);
    local_ac = (int)qVar5;
    in_stack_fffffffffffffe90 = &pQVar4->tabList;
    operator_new(0xf0);
    QTabBarPrivate::Tab::Tab
              ((Tab *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (QIcon *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (QString *)in_stack_fffffffffffffe30);
    QList<QTabBarPrivate::Tab_*>::append
              ((QList<QTabBarPrivate::Tab_*> *)0x6ac961,in_stack_fffffffffffffe28);
  }
  QKeySequence::mnemonic((QString *)local_b8);
  iVar3 = QWidget::grabShortcut
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (QKeySequence *)in_stack_fffffffffffffe30,
                     (ShortcutContext)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  ppTVar6 = QList<QTabBarPrivate::Tab_*>::at
                      ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffe30,
                       (qsizetype)in_stack_fffffffffffffe28);
  (*ppTVar6)->shortcutId = iVar3;
  QKeySequence::~QKeySequence(local_b8);
  piVar7 = qMin<int>(&local_ac,&pQVar4->firstVisible);
  local_bc = 0;
  piVar7 = qMax<int>(piVar7,&local_bc);
  pQVar4->firstVisible = *piVar7;
  QTabBarPrivate::refresh(in_stack_fffffffffffffe30);
  qVar5 = QList<QTabBarPrivate::Tab_*>::size(&pQVar4->tabList);
  if (qVar5 == 1) {
    setCurrentIndex((QTabBar *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  }
  else if (local_ac <= pQVar4->currentIndex) {
    pQVar4->currentIndex = pQVar4->currentIndex + 1;
  }
  if (pQVar4->lastVisible < local_ac) {
    pQVar4->lastVisible = local_ac;
  }
  else {
    pQVar4->lastVisible = pQVar4->lastVisible + 1;
  }
  if ((*(ushort *)&pQVar4->field_0x2d0 >> 6 & 1) != 0) {
    in_stack_fffffffffffffe48 = (parameter_type)&DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffe50 = (CloseButton *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)0x6acbb1);
    (**(code **)(*in_RDI + 0x1c8))(in_RDI,&local_a8,local_ac);
    pQVar8 = QWidget::style((QWidget *)in_stack_fffffffffffffe28);
    (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x5c,0,in_RDI);
    operator_new(0x28);
    anon_unknown.dwarf_e10892::CloseButton::CloseButton
              (in_stack_fffffffffffffe50,(QWidget *)in_stack_fffffffffffffe48);
    local_d8 = QTabBarPrivate::closeTab;
    local_d0 = 0;
    in_stack_fffffffffffffe30 = (QTabBarPrivate *)0x0;
    QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
              ((Object *)in_stack_fffffffffffffe90,0,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffeb0,type);
    QMetaObject::Connection::~Connection(&local_c8);
    setTabButton((QTabBar *)in_stack_fffffffffffffe50,
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (ButtonPosition)in_stack_fffffffffffffe48,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    QStyleOptionTab::~QStyleOptionTab((QStyleOptionTab *)in_stack_fffffffffffffe30);
  }
  local_e0.i = (Tab **)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = QList<QTabBarPrivate::Tab_*>::begin
                       ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffe30);
  o = QList<QTabBarPrivate::Tab_*>::end((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffe30);
  while (bVar2 = QList<QTabBarPrivate::Tab_*>::const_iterator::operator!=(&local_e0,o), bVar2) {
    ppTVar9 = QList<QTabBarPrivate::Tab_*>::const_iterator::operator*(&local_e0);
    pTVar1 = *ppTVar9;
    if (local_ac <= pTVar1->lastTab) {
      pTVar1->lastTab = pTVar1->lastTab + 1;
    }
    QList<QTabBarPrivate::Tab_*>::const_iterator::operator++(&local_e0);
  }
  iVar3 = tabAt((QTabBar *)in_stack_fffffffffffffe50,(QPoint *)in_stack_fffffffffffffe48);
  if (iVar3 == local_ac) {
    pQVar4->hoverIndex = local_ac;
    QVar10 = tabRect(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    local_100 = QVar10._0_8_;
    *(undefined8 *)&(pQVar4->super_QWidgetPrivate).field_0x254 = local_100;
    local_f8 = QVar10._8_8_;
    *(undefined8 *)&pQVar4->field_0x25c = local_f8;
  }
  (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_ac);
  QTabBarPrivate::autoHideTabs
            ((QTabBarPrivate *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_ac;
}

Assistant:

int QTabBar::insertTab(int index, const QIcon& icon, const QString &text)
{
    Q_D(QTabBar);
    if (!d->validIndex(index)) {
        index = d->tabList.size();
        d->tabList.append(new QTabBarPrivate::Tab(icon, text));
    } else {
        d->tabList.insert(index, new QTabBarPrivate::Tab(icon, text));
    }
#ifndef QT_NO_SHORTCUT
    d->tabList.at(index)->shortcutId = grabShortcut(QKeySequence::mnemonic(text));
#endif
    d->firstVisible = qMax(qMin(index, d->firstVisible), 0);
    d->refresh();
    if (d->tabList.size() == 1)
        setCurrentIndex(index);
    else if (index <= d->currentIndex)
        ++d->currentIndex;

    if (index <= d->lastVisible)
        ++d->lastVisible;
    else
        d->lastVisible = index;

    if (d->closeButtonOnTabs) {
        QStyleOptionTab opt;
        initStyleOption(&opt, index);
        ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
        QAbstractButton *closeButton = new CloseButton(this);
        QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                d, &QTabBarPrivate::closeTab);
        setTabButton(index, closeSide, closeButton);
    }

    for (const auto tab : std::as_const(d->tabList)) {
        if (tab->lastTab >= index)
            ++tab->lastTab;
    }

    if (tabAt(d->mousePosition) == index) {
        d->hoverIndex = index;
        d->hoverRect = tabRect(index);
    }

    tabInserted(index);
    d->autoHideTabs();
    return index;
}